

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::InitScanFiles(cmQtAutoGenInitializer *this)

{
  string *prop;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *this_00;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *this_01;
  string *psVar1;
  uint uVar2;
  cmQtAutoGenGlobalInitializer *pcVar3;
  cmSourceFile *this_02;
  _Hash_node_base *p_Var4;
  pointer pbVar5;
  pointer ppMVar6;
  MUFile *text;
  pointer pQVar7;
  pointer pQVar8;
  key_type *pkVar9;
  pointer puVar10;
  __type _Var11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  FileFormat FVar15;
  cmMakefile *this_03;
  string *psVar16;
  string *psVar17;
  char *pcVar18;
  cmake *pcVar19;
  iterator iVar20;
  long lVar21;
  string *ext;
  mapped_type *this_04;
  pointer ppcVar22;
  ulong uVar23;
  __node_base *p_Var24;
  undefined8 uVar25;
  byte bVar26;
  string *extraout_RDX;
  unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
  *eMuf_1;
  pointer muf;
  pointer pQVar27;
  pointer ppcVar28;
  key_type *__rhs;
  undefined1 rcc;
  undefined8 in_R8;
  pointer pQVar29;
  pointer pbVar30;
  pointer ppMVar31;
  iterator __begin3;
  string pathError;
  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
  extraHeaders;
  string opts;
  cmSourceFile *sf;
  MUFileHandle eMuf;
  anon_class_8_1_8991fb9c addMUFile;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  anon_class_16_2_e88080e7 makeMUFile;
  Qrc qrc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  PolicyID id;
  
  this_03 = cmTarget::GetMakefile(this->Target->Target);
  pcVar3 = this->GlobalInitializer;
  makeMUFile.kw = &pcVar3->Keywords_;
  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  addMUFile.this = this;
  makeMUFile.this = this;
  cmGeneratorTarget::GetConfigCommonSourceFiles(this->Target,&srcFiles);
  ppcVar28 = srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  psVar1 = &(pcVar3->Keywords_).SKIP_AUTOGEN;
  prop = &(pcVar3->Keywords_).AUTORCC_OPTIONS;
  for (ppcVar22 = srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; uVar25 = 1, ppcVar22 != ppcVar28;
      ppcVar22 = ppcVar22 + 1) {
    this_02 = *ppcVar22;
    pathError._M_dataplus._M_p = (pointer)&pathError.field_2;
    pathError._M_string_length = 0;
    pathError.field_2._M_local_buf[0] = '\0';
    psVar16 = cmSourceFile::GetFullPath(this_02,&pathError);
    if ((pathError._M_string_length == 0) && (psVar16->_M_string_length != 0)) {
      psVar17 = cmSourceFile::GetExtension_abi_cxx11_(this_02);
      if (((this->Moc).super_GenVarsT.Enabled != false) ||
         (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
        FVar15 = cmSystemTools::GetFileFormat(psVar17);
        if (FVar15 == CXX_FILE_FORMAT) {
          InitScanFiles::anon_class_16_2_e88080e7::operator()
                    ((anon_class_16_2_e88080e7 *)&qrc,(cmSourceFile *)&makeMUFile,(string *)this_02,
                     SUB81(psVar16,0));
          InitScanFiles::anon_class_8_1_8991fb9c::operator()(&addMUFile,(MUFileHandle *)&qrc,false);
        }
        else {
          if (FVar15 != HEADER_FILE_FORMAT) goto LAB_002aff27;
          InitScanFiles::anon_class_16_2_e88080e7::operator()
                    ((anon_class_16_2_e88080e7 *)&qrc,(cmSourceFile *)&makeMUFile,(string *)this_02,
                     SUB81(psVar16,0));
          InitScanFiles::anon_class_8_1_8991fb9c::operator()(&addMUFile,(MUFileHandle *)&qrc,true);
        }
        std::
        unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
        ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                       *)&qrc);
        in_R8 = uVar25;
      }
LAB_002aff27:
      if (((((this->Rcc).super_GenVarsT.Enabled == true) &&
           (_Var11 = std::operator==(psVar17,&(pcVar3->Keywords_).qrc), _Var11)) &&
          (bVar12 = cmSourceFile::GetPropertyAsBool(this_02,psVar1), !bVar12)) &&
         (bVar12 = cmSourceFile::GetPropertyAsBool(this_02,&(pcVar3->Keywords_).SKIP_AUTORCC),
         !bVar12)) {
        qrc.LockFile._M_dataplus._M_p = (pointer)&qrc.LockFile.field_2;
        qrc.LockFile._M_string_length = 0;
        qrc.LockFile.field_2._M_local_buf[0] = '\0';
        qrc.QrcFile._M_dataplus._M_p = (pointer)&qrc.QrcFile.field_2;
        qrc.QrcFile._M_string_length = 0;
        qrc.QrcFile.field_2._M_local_buf[0] = '\0';
        qrc.QrcName._M_dataplus._M_p = (pointer)&qrc.QrcName.field_2;
        qrc.QrcName._M_string_length = 0;
        qrc.QrcName.field_2._M_local_buf[0] = '\0';
        qrc.PathChecksum._M_dataplus._M_p = (pointer)&qrc.PathChecksum.field_2;
        qrc.PathChecksum._M_string_length = 0;
        qrc.PathChecksum.field_2._M_local_buf[0] = '\0';
        qrc.InfoFile._M_dataplus._M_p = (pointer)&qrc.InfoFile.field_2;
        qrc.InfoFile._M_string_length = 0;
        qrc.InfoFile.field_2._M_local_buf[0] = '\0';
        qrc.SettingsFile._M_dataplus._M_p = (pointer)&qrc.SettingsFile.field_2;
        qrc.SettingsFile._M_string_length = 0;
        qrc.SettingsFile.field_2._M_local_buf[0] = '\0';
        qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header;
        qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        qrc.RccFile._M_dataplus._M_p = (pointer)&qrc.RccFile.field_2;
        qrc.RccFile._M_string_length = 0;
        qrc.RccFile.field_2._M_local_buf[0] = '\0';
        qrc.Generated = false;
        qrc.Unique = false;
        qrc.Resources.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        qrc.Resources.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        qrc.Options.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        qrc.Resources.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        qrc.Options.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        qrc.Options.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             qrc.ConfigSettingsFile._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        cmsys::SystemTools::GetRealPath(&opts,psVar16,(string *)0x0);
        std::__cxx11::string::operator=((string *)&qrc.QrcFile,(string *)&opts);
        std::__cxx11::string::~string((string *)&opts);
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&opts,&qrc.QrcFile);
        std::__cxx11::string::operator=((string *)&qrc.QrcName,(string *)&opts);
        std::__cxx11::string::~string((string *)&opts);
        qrc.Generated = this_02->IsGenerated;
        pcVar18 = cmSourceFile::GetSafeProperty(this_02,prop);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&opts,pcVar18,(allocator<char> *)&extraHeaders);
        if (opts._M_string_length != 0) {
          cmSystemTools::ExpandListArgument(&opts,&qrc.Options,false);
        }
        std::__cxx11::string::~string((string *)&opts);
        std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
        emplace_back<cmQtAutoGenInitializer::Qrc>(&(this->Rcc).Qrcs,&qrc);
        Qrc::~Qrc(&qrc);
      }
    }
    std::__cxx11::string::~string((string *)&pathError);
  }
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  cmGeneratorTarget::ClearSourcesCache(this->Target);
  bVar12 = (this->Moc).super_GenVarsT.Enabled;
  uVar23 = CONCAT71((int7)((ulong)ppcVar22 >> 8),bVar12);
  bVar14 = (this->Uic).super_GenVarsT.Enabled;
  if (((bVar14 | bVar12) & 1) != 0) {
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::reserve(&extraHeaders,(this->AutogenTarget).Sources._M_h._M_element_count * 2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&qrc,"",(allocator<char> *)&pathError);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&qrc.QrcFile,"_p",(allocator<char> *)&opts);
    pcVar19 = cmMakefile::GetCMakeInstance(this_03);
    p_Var24 = &(this->AutogenTarget).Sources._M_h._M_before_begin;
    while (puVar10 = extraHeaders.
                     super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish, p_Var24 = p_Var24->_M_nxt,
          p_Var24 != (__node_base *)0x0) {
      p_Var4 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var24 + 2))->_M_max_load_factor;
      if ((*(char *)((long)&p_Var4[5]._M_nxt + 3) != '\0') ||
         (*(char *)((long)&p_Var4[5]._M_nxt + 4) == '\x01')) {
        psVar16 = cmSourceFile::GetFullPath((cmSourceFile *)p_Var4[4]._M_nxt,(string *)0x0);
        cmQtAutoGen::SubDirPrefix(&pathError,psVar16);
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&opts,psVar16);
        std::__cxx11::string::append((string *)&pathError);
        std::__cxx11::string::~string((string *)&opts);
        for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 0x20) {
          std::operator+(&opts,&pathError,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&qrc.LockFile._M_dataplus._M_p + lVar21));
          pbVar5 = (pcVar19->HeaderFileExtensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar30 = (pcVar19->HeaderFileExtensions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar30 != pbVar5;
              pbVar30 = pbVar30 + 1) {
            std::__cxx11::string::string((string *)&srcFiles,(string *)&opts);
            bVar12 = SUB81((string *)&srcFiles,0);
            std::__cxx11::string::push_back(bVar12);
            std::__cxx11::string::append((string *)&srcFiles);
            sf = cmMakefile::GetSource(this_03,(string *)&srcFiles,Known);
            if (sf == (cmSourceFile *)0x0) {
              bVar13 = cmsys::SystemTools::FileExists((string *)&srcFiles);
              if (bVar13) {
                sf = cmMakefile::CreateSource(this_03,(string *)&srcFiles,false,Known);
              }
              if (sf != (cmSourceFile *)0x0) goto LAB_002b0390;
            }
            else {
              iVar20 = std::
                       _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(&(this->AutogenTarget).Headers._M_h,&sf);
              if ((iVar20.
                   super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                   ._M_cur == (__node_type *)0x0) &&
                 ((sf->IsGenerated != false ||
                  (bVar13 = cmsys::SystemTools::FileExists((string *)&srcFiles),
                  bVar13 && sf != (cmSourceFile *)0x0)))) {
LAB_002b0390:
                in_R8 = 1;
                InitScanFiles::anon_class_16_2_e88080e7::operator()
                          ((anon_class_16_2_e88080e7 *)&eMuf,(cmSourceFile *)&makeMUFile,
                           (string *)sf,bVar12);
                if (*(char *)((long)&p_Var4[5]._M_nxt + 3) == '\0') {
                  *(undefined1 *)
                   ((long)eMuf._M_t.
                          super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>.
                          _M_head_impl + 0x2b) = 0;
                }
                if (*(char *)((long)&p_Var4[5]._M_nxt + 4) == '\0') {
                  *(undefined1 *)
                   ((long)eMuf._M_t.
                          super___uniq_ptr_impl<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmQtAutoGenInitializer::MUFile_*,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                          .super__Head_base<0UL,_cmQtAutoGenInitializer::MUFile_*,_false>.
                          _M_head_impl + 0x2c) = 0;
                }
                std::
                vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                ::
                emplace_back<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                          ((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                            *)&extraHeaders,&eMuf);
                std::
                unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                ::~unique_ptr(&eMuf);
              }
            }
            std::__cxx11::string::~string((string *)&srcFiles);
          }
          std::__cxx11::string::~string((string *)&opts);
        }
        std::__cxx11::string::~string((string *)&pathError);
      }
    }
    uVar25 = 0;
    for (muf = extraHeaders.
               super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; muf != puVar10; muf = muf + 1) {
      InitScanFiles::anon_class_8_1_8991fb9c::operator()(&addMUFile,muf,true);
    }
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)&qrc);
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::~vector(&extraHeaders);
    uVar23 = CONCAT71((int7)((ulong)uVar25 >> 8),(this->Moc).super_GenVarsT.Enabled);
    bVar14 = (this->Uic).super_GenVarsT.Enabled;
  }
  bVar26 = (byte)(uVar23 & 0xffffffff) | bVar14;
  id = (PolicyID)CONCAT71((int7)((uVar23 & 0xffffffff) >> 8),bVar26);
  if ((bVar26 & 1) != 0) {
    ppcVar22 = (this_03->SourceFiles).
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    this_00 = &(this->AutogenTarget).Sources;
    this_01 = &(this->AutogenTarget).Headers;
    psVar16 = &(pcVar3->Keywords_).SKIP_AUTOUIC;
    psVar17 = psVar16;
    for (ppcVar28 = (this_03->SourceFiles).
                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                    super__Vector_impl_data._M_start; id = (PolicyID)psVar17, ppcVar28 != ppcVar22;
        ppcVar28 = ppcVar28 + 1) {
      extraHeaders.
      super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)*ppcVar28;
      qrc.LockFile._M_dataplus._M_p = (pointer)&qrc.LockFile.field_2;
      qrc.LockFile._M_string_length = 0;
      qrc.LockFile.field_2._M_local_buf[0] = '\0';
      psVar17 = cmSourceFile::GetFullPath
                          ((cmSourceFile *)
                           extraHeaders.
                           super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,&qrc.LockFile);
      if ((qrc.LockFile._M_string_length == 0) && (psVar17->_M_string_length != 0)) {
        ext = cmSourceFile::GetExtension_abi_cxx11_
                        ((cmSourceFile *)
                         extraHeaders.
                         super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        FVar15 = cmSystemTools::GetFileFormat(ext);
        if (FVar15 == CXX_FILE_FORMAT) {
          iVar20 = std::
                   _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&this_00->_M_h,(key_type *)&extraHeaders);
          if (iVar20.
              super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            in_R8 = 0;
            InitScanFiles::anon_class_16_2_e88080e7::operator()
                      ((anon_class_16_2_e88080e7 *)&pathError,(cmSourceFile *)&makeMUFile,
                       (string *)
                       extraHeaders.
                       super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,SUB81(psVar17,0));
            if ((pathError._M_dataplus._M_p[0x29] != '\0') ||
               (pathError._M_dataplus._M_p[0x2a] == '\x01')) {
              std::
              _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::
              _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                        ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)this_00,&extraHeaders,&pathError);
            }
LAB_002b0657:
            std::
            unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
            ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                           *)&pathError);
          }
        }
        else if (FVar15 == HEADER_FILE_FORMAT) {
          iVar20 = std::
                   _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&this_01->_M_h,(key_type *)&extraHeaders);
          if (iVar20.
              super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            in_R8 = 0;
            InitScanFiles::anon_class_16_2_e88080e7::operator()
                      ((anon_class_16_2_e88080e7 *)&pathError,(cmSourceFile *)&makeMUFile,
                       (string *)
                       extraHeaders.
                       super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,SUB81(psVar17,0));
            if ((pathError._M_dataplus._M_p[0x29] != '\0') ||
               (pathError._M_dataplus._M_p[0x2a] == '\x01')) {
              std::
              _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::
              _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                        ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)this_01,&extraHeaders,&pathError);
            }
            goto LAB_002b0657;
          }
        }
        else if (((this->Uic).super_GenVarsT.Enabled == true) &&
                (_Var11 = std::operator==(ext,&(pcVar3->Keywords_).ui), _Var11)) {
          cmsys::SystemTools::GetRealPath(&pathError,psVar17,(string *)0x0);
          bVar12 = cmSourceFile::GetPropertyAsBool
                             ((cmSourceFile *)
                              extraHeaders.
                              super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,psVar1);
          if ((bVar12) ||
             (bVar12 = cmSourceFile::GetPropertyAsBool
                                 ((cmSourceFile *)
                                  extraHeaders.
                                  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,psVar16), bVar12)) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&(this->Uic).SkipUi,&pathError);
          }
          else {
            pcVar18 = cmSourceFile::GetSafeProperty
                                ((cmSourceFile *)
                                 extraHeaders.
                                 super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 &(pcVar3->Keywords_).AUTOUIC_OPTIONS);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&opts,pcVar18,(allocator<char> *)&srcFiles);
            if (opts._M_string_length != 0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &(this->Uic).FileFiles,&pathError);
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmSystemTools::ExpandListArgument
                        (&opts,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&srcFiles,false);
              std::
              vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          *)&(this->Uic).FileOptions,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&srcFiles);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&srcFiles);
            }
            std::__cxx11::string::~string((string *)&opts);
          }
          std::__cxx11::string::~string((string *)&pathError);
        }
      }
      std::__cxx11::string::~string((string *)&qrc);
      psVar17 = extraout_RDX;
    }
    uVar23 = (ulong)(this->Moc).super_GenVarsT.Enabled;
    bVar14 = (this->Uic).super_GenVarsT.Enabled;
  }
  if (((uVar23 & 1) != 0) || ((bVar14 & 1) != 0)) {
    ppMVar31 = (this->AutogenTarget).FilesGenerated.
               super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppMVar6 = (this->AutogenTarget).FilesGenerated.
              super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppMVar31 != ppMVar6) {
      if (this->CMP0071Accept == true) {
        for (; ppMVar31 != ppMVar6; ppMVar31 = ppMVar31 + 1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&(this->AutogenTarget).DependFiles,&(*ppMVar31)->RealPath);
        }
      }
      else if (this->CMP0071Warn == true) {
        qrc.LockFile._M_dataplus._M_p = (pointer)&qrc.LockFile.field_2;
        qrc.LockFile._M_string_length = 0;
        qrc.LockFile.field_2._M_local_buf[0] = '\0';
        cmPolicies::GetPolicyWarning_abi_cxx11_(&pathError,(cmPolicies *)0x47,id);
        std::__cxx11::string::append((string *)&qrc);
        std::__cxx11::string::~string((string *)&pathError);
        std::__cxx11::string::push_back((char)&qrc);
        pathError._M_dataplus._M_p = (pointer)&pathError.field_2;
        pathError._M_string_length = 0;
        pathError.field_2._M_local_buf[0] = '\0';
        if (((this->Moc).super_GenVarsT.Enabled == true) ||
           ((this->Uic).super_GenVarsT.Enabled != false)) {
          std::__cxx11::string::_M_assign((string *)&pathError);
        }
        std::__cxx11::string::append((char *)&qrc);
        ppMVar6 = (this->AutogenTarget).FilesGenerated.
                  super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppMVar31 = (this->AutogenTarget).FilesGenerated.
                        super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; rcc = (undefined1)in_R8,
            ppMVar31 != ppMVar6; ppMVar31 = ppMVar31 + 1) {
          text = *ppMVar31;
          std::__cxx11::string::append((char *)&qrc);
          cmQtAutoGen::Quoted(&opts,&text->RealPath);
          std::__cxx11::string::append((string *)&qrc);
          std::__cxx11::string::~string((string *)&opts);
          std::__cxx11::string::push_back((char)&qrc);
        }
        std::__cxx11::string::append((char *)&qrc);
        cmQtAutoGen::Tools_abi_cxx11_
                  (&opts,(cmQtAutoGen *)(ulong)(this->Moc).super_GenVarsT.Enabled,
                   (this->Uic).super_GenVarsT.Enabled,false,(bool)rcc);
        std::__cxx11::string::append((string *)&qrc);
        std::__cxx11::string::~string((string *)&opts);
        std::__cxx11::string::append((char *)&qrc);
        std::__cxx11::string::append((string *)&qrc);
        std::__cxx11::string::append((char *)&qrc);
        std::__cxx11::string::append((string *)&qrc);
        std::__cxx11::string::append((char *)&qrc);
        cmMakefile::IssueMessage(this_03,AUTHOR_WARNING,&qrc.LockFile);
        std::__cxx11::string::~string((string *)&pathError);
        std::__cxx11::string::~string((string *)&qrc);
      }
    }
  }
  if ((this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar2 = (this->QtVersion).Major;
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    extraHeaders.
    super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar18 = cmGeneratorTarget::GetSafeProperty(this->Target,prop);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&qrc,pcVar18,(allocator<char> *)&pathError);
    cmSystemTools::ExpandListArgument
              (&qrc.LockFile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&extraHeaders,false);
    std::__cxx11::string::~string((string *)&qrc);
    pQVar7 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar27 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar27 != pQVar7;
        pQVar27 = pQVar27 + 1) {
      pQVar27->Unique = true;
      pQVar8 = (this->Rcc).Qrcs.
               super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pQVar29 = (this->Rcc).Qrcs.
                     super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                     ._M_impl.super__Vector_impl_data._M_start; pQVar29 != pQVar8;
          pQVar29 = pQVar29 + 1) {
        if ((pQVar29 != pQVar27) &&
           (_Var11 = std::operator==(&pQVar27->QrcName,&pQVar29->QrcName), _Var11)) {
          pQVar27->Unique = false;
          break;
        }
      }
    }
    cmFilePathChecksum::cmFilePathChecksum((cmFilePathChecksum *)&qrc,this_03);
    pQVar7 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar27 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar27 != pQVar7;
        pQVar27 = pQVar27 + 1) {
      cmFilePathChecksum::getPart(&pathError,(cmFilePathChecksum *)&qrc,&pQVar27->QrcFile,10);
      std::__cxx11::string::operator=((string *)&pQVar27->PathChecksum,(string *)&pathError);
      std::__cxx11::string::~string((string *)&pathError);
      std::operator+(&pathError,&(this->Dir).Build,"/");
      std::__cxx11::string::append((string *)&pathError);
      std::__cxx11::string::append((char *)&pathError);
      std::__cxx11::string::append((string *)&pathError);
      std::__cxx11::string::append((char *)&pathError);
      std::__cxx11::string::operator=((string *)&pQVar27->RccFile,(string *)&pathError);
      std::__cxx11::string::~string((string *)&pathError);
      std::__cxx11::string::string((string *)&pathError,(string *)&this->Dir);
      std::__cxx11::string::append((char *)&pathError);
      std::__cxx11::string::append((string *)&pathError);
      if (pQVar27->Unique == false) {
        std::__cxx11::string::append((string *)&pathError);
      }
      std::__cxx11::string::_M_assign((string *)pQVar27);
      std::__cxx11::string::append((char *)pQVar27);
      std::__cxx11::string::_M_assign((string *)&pQVar27->InfoFile);
      std::__cxx11::string::append((char *)&pQVar27->InfoFile);
      psVar1 = &pQVar27->SettingsFile;
      std::__cxx11::string::_M_assign((string *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      if (this->MultiConfig == true) {
        pkVar9 = (this->ConfigsList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__rhs = (this->ConfigsList).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; __rhs != pkVar9; __rhs = __rhs + 1)
        {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &srcFiles,"_",__rhs);
          cmQtAutoGen::AppendFilenameSuffix
                    (&opts,psVar1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcFiles)
          ;
          this_04 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&pQVar27->ConfigSettingsFile,__rhs);
          std::__cxx11::string::operator=((string *)this_04,(string *)&opts);
          std::__cxx11::string::~string((string *)&opts);
          std::__cxx11::string::~string((string *)&srcFiles);
        }
      }
      std::__cxx11::string::~string((string *)&pathError);
    }
    std::
    array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
    ::~array((array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
              *)&qrc);
    pQVar7 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar27 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar27 != pQVar7;
        pQVar27 = pQVar27 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&pathError,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&extraHeaders);
      std::__cxx11::string::string((string *)&qrc,(string *)&pQVar27->QrcName);
      opts._M_dataplus._M_p._0_1_ = 0x2d;
      srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(srcFiles.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,0x5f);
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )qrc.LockFile._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(qrc.LockFile._M_dataplus._M_p + qrc.LockFile._M_string_length),(char *)&opts,
                 (char *)&srcFiles);
      if (pQVar27->Unique == false) {
        std::__cxx11::string::append((char *)&qrc);
        std::__cxx11::string::append((string *)&qrc);
      }
      opts._M_dataplus._M_p = (pointer)0x0;
      opts._M_string_length = 0;
      opts.field_2._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[6]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&opts,
                 (char (*) [6])0x451df6);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&opts,
                 &qrc.LockFile);
      cmQtAutoGen::RccMergeOptions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&pathError,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&opts,4 < uVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&opts);
      std::__cxx11::string::~string((string *)&qrc);
      cmQtAutoGen::RccMergeOptions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&pathError,&pQVar27->Options,4 < uVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&pQVar27->Options,&pathError);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pathError);
    }
    pQVar7 = (this->Rcc).Qrcs.
             super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar27 = (this->Rcc).Qrcs.
                   super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pQVar27 != pQVar7;
        pQVar27 = pQVar27 + 1) {
      if (pQVar27->Generated == false) {
        pathError._M_dataplus._M_p = (pointer)&pathError.field_2;
        pathError._M_string_length = 0;
        pathError.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string
                  ((string *)&local_50,(string *)&(this->Rcc).super_GenVarsT.Executable);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_68,
                 &((this->Rcc).super_GenVarsT.ExecutableFeatures.
                   super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->ListOptions);
        cmQtAutoGen::RccLister::RccLister((RccLister *)&qrc,&local_50,&local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        std::__cxx11::string::~string((string *)&local_50);
        bVar12 = cmQtAutoGen::RccLister::list
                           ((RccLister *)&qrc,&pQVar27->QrcFile,&pQVar27->Resources,&pathError,false
                           );
        if (!bVar12) {
          cmSystemTools::Error(&pathError);
          cmQtAutoGen::RccLister::~RccLister((RccLister *)&qrc);
          std::__cxx11::string::~string((string *)&pathError);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&extraHeaders);
          return false;
        }
        cmQtAutoGen::RccLister::~RccLister((RccLister *)&qrc);
        std::__cxx11::string::~string((string *)&pathError);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&extraHeaders);
  }
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitScanFiles()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  auto const& kw = this->GlobalInitializer->kw();

  auto makeMUFile = [this, &kw](cmSourceFile* sf, std::string const& fullPath,
                                bool muIt) -> MUFileHandle {
    MUFileHandle muf = cm::make_unique<MUFile>();
    muf->RealPath = cmSystemTools::GetRealPath(fullPath);
    muf->SF = sf;
    muf->Generated = sf->GetIsGenerated();
    bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
    muf->SkipMoc = this->Moc.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOMOC));
    muf->SkipUic = this->Uic.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
    if (muIt) {
      muf->MocIt = this->Moc.Enabled && !muf->SkipMoc;
      muf->UicIt = this->Uic.Enabled && !muf->SkipUic;
    }
    return muf;
  };

  auto addMUFile = [&](MUFileHandle&& muf, bool isHeader) {
    if ((muf->MocIt || muf->UicIt) && muf->Generated) {
      this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
    }
    if (isHeader) {
      this->AutogenTarget.Headers.emplace(muf->SF, std::move(muf));
    } else {
      this->AutogenTarget.Sources.emplace(muf->SF, std::move(muf));
    }
  };

  // Scan through target files
  {
    // Scan through target files
    std::vector<cmSourceFile*> srcFiles;
    this->Target->GetConfigCommonSourceFiles(srcFiles);
    for (cmSourceFile* sf : srcFiles) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      // Register files that will be scanned by moc or uic
      if (this->MocOrUicEnabled()) {
        switch (cmSystemTools::GetFileFormat(ext)) {
          case cmSystemTools::HEADER_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), true);
            break;
          case cmSystemTools::CXX_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), false);
            break;
          default:
            break;
        }
      }

      // Register rcc enabled files
      if (this->Rcc.Enabled) {
        if ((ext == kw.qrc) && !sf->GetPropertyAsBool(kw.SKIP_AUTOGEN) &&
            !sf->GetPropertyAsBool(kw.SKIP_AUTORCC)) {
          // Register qrc file
          Qrc qrc;
          qrc.QrcFile = cmSystemTools::GetRealPath(fullPath);
          qrc.QrcName =
            cmSystemTools::GetFilenameWithoutLastExtension(qrc.QrcFile);
          qrc.Generated = sf->GetIsGenerated();
          // RCC options
          {
            std::string const opts = sf->GetSafeProperty(kw.AUTORCC_OPTIONS);
            if (!opts.empty()) {
              cmSystemTools::ExpandListArgument(opts, qrc.Options);
            }
          }
          this->Rcc.Qrcs.push_back(std::move(qrc));
        }
      }
    }
  }
  // cmGeneratorTarget::GetConfigCommonSourceFiles computes the target's
  // sources meta data cache. Clear it so that OBJECT library targets that
  // are AUTOGEN initialized after this target get their added
  // mocs_compilation.cpp source acknowledged by this target.
  this->Target->ClearSourcesCache();

  // For source files find additional headers and private headers
  if (this->MocOrUicEnabled()) {
    std::vector<MUFileHandle> extraHeaders;
    extraHeaders.reserve(this->AutogenTarget.Sources.size() * 2);
    // Header search suffixes and extensions
    std::array<std::string, 2> const suffixes{ { "", "_p" } };
    auto const& exts = makefile->GetCMakeInstance()->GetHeaderExtensions();
    // Scan through sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.MocIt || muf.UicIt) {
        // Search for the default header file and a private header
        std::string const& srcPath = muf.SF->GetFullPath();
        std::string basePath = cmQtAutoGen::SubDirPrefix(srcPath);
        basePath += cmSystemTools::GetFilenameWithoutLastExtension(srcPath);
        for (auto const& suffix : suffixes) {
          std::string const suffixedPath = basePath + suffix;
          for (auto const& ext : exts) {
            std::string fullPath = suffixedPath;
            fullPath += '.';
            fullPath += ext;

            auto constexpr locationKind = cmSourceFileLocationKind::Known;
            cmSourceFile* sf = makefile->GetSource(fullPath, locationKind);
            if (sf != nullptr) {
              // Check if we know about this header already
              if (this->AutogenTarget.Headers.find(sf) !=
                  this->AutogenTarget.Headers.end()) {
                continue;
              }
              // We only accept not-GENERATED files that do exist.
              if (!sf->GetIsGenerated() &&
                  !cmSystemTools::FileExists(fullPath)) {
                continue;
              }
            } else if (cmSystemTools::FileExists(fullPath)) {
              // Create a new source file for the existing file
              sf = makefile->CreateSource(fullPath, false, locationKind);
            }

            if (sf != nullptr) {
              auto eMuf = makeMUFile(sf, fullPath, true);
              // Ony process moc/uic when the parent is processed as well
              if (!muf.MocIt) {
                eMuf->MocIt = false;
              }
              if (!muf.UicIt) {
                eMuf->UicIt = false;
              }
              extraHeaders.emplace_back(std::move(eMuf));
            }
          }
        }
      }
    }
    // Move generated files to main headers list
    for (auto& eMuf : extraHeaders) {
      addMUFile(std::move(eMuf), true);
    }
  }

  // Scan through all source files in the makefile to extract moc and uic
  // parameters.  Historically we support non target source file parameters.
  // The reason is that their file names might be discovered from source files
  // at generation time.
  if (this->MocOrUicEnabled()) {
    for (cmSourceFile* sf : makefile->GetSourceFiles()) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      auto const fileFormat = cmSystemTools::GetFileFormat(ext);
      if (fileFormat == cmSystemTools::HEADER_FILE_FORMAT) {
        if (this->AutogenTarget.Headers.find(sf) ==
            this->AutogenTarget.Headers.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Headers.emplace(sf, std::move(muf));
          }
        }
      } else if (fileFormat == cmSystemTools::CXX_FILE_FORMAT) {
        if (this->AutogenTarget.Sources.find(sf) ==
            this->AutogenTarget.Sources.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Sources.emplace(sf, std::move(muf));
          }
        }
      } else if (this->Uic.Enabled && (ext == kw.ui)) {
        // .ui file
        std::string realPath = cmSystemTools::GetRealPath(fullPath);
        bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
        bool const skipUic =
          (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
        if (!skipUic) {
          // Check if the .ui file has uic options
          std::string const uicOpts = sf->GetSafeProperty(kw.AUTOUIC_OPTIONS);
          if (!uicOpts.empty()) {
            this->Uic.FileFiles.push_back(std::move(realPath));
            std::vector<std::string> optsVec;
            cmSystemTools::ExpandListArgument(uicOpts, optsVec);
            this->Uic.FileOptions.push_back(std::move(optsVec));
          }
        } else {
          // Register skipped .ui file
          this->Uic.SkipUi.insert(std::move(realPath));
        }
      }
    }
  }

  // Process GENERATED sources and headers
  if (this->MocOrUicEnabled() && !this->AutogenTarget.FilesGenerated.empty()) {
    if (this->CMP0071Accept) {
      // Let the autogen target depend on the GENERATED files
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        this->AutogenTarget.DependFiles.insert(muf->RealPath);
      }
    } else if (this->CMP0071Warn) {
      std::string msg;
      msg += cmPolicies::GetPolicyWarning(cmPolicies::CMP0071);
      msg += '\n';
      std::string property;
      if (this->Moc.Enabled && this->Uic.Enabled) {
        property = kw.SKIP_AUTOGEN;
      } else if (this->Moc.Enabled) {
        property = kw.SKIP_AUTOMOC;
      } else if (this->Uic.Enabled) {
        property = kw.SKIP_AUTOUIC;
      }
      msg += "For compatibility, CMake is excluding the GENERATED source "
             "file(s):\n";
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        msg += "  ";
        msg += Quoted(muf->RealPath);
        msg += '\n';
      }
      msg += "from processing by ";
      msg += cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false);
      msg += ". If any of the files should be processed, set CMP0071 to NEW. "
             "If any of the files should not be processed, "
             "explicitly exclude them by setting the source file property ";
      msg += property;
      msg += ":\n  set_property(SOURCE file.h PROPERTY ";
      msg += property;
      msg += " ON)\n";
      makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
    }
  }

  // Process qrc files
  if (!this->Rcc.Qrcs.empty()) {
    const bool modernQt = (this->QtVersion.Major >= 5);
    // Target rcc options
    std::vector<std::string> optionsTarget;
    cmSystemTools::ExpandListArgument(
      this->Target->GetSafeProperty(kw.AUTORCC_OPTIONS), optionsTarget);

    // Check if file name is unique
    for (Qrc& qrc : this->Rcc.Qrcs) {
      qrc.Unique = true;
      for (Qrc const& qrc2 : this->Rcc.Qrcs) {
        if ((&qrc != &qrc2) && (qrc.QrcName == qrc2.QrcName)) {
          qrc.Unique = false;
          break;
        }
      }
    }
    // Path checksum and file names
    {
      cmFilePathChecksum const fpathCheckSum(makefile);
      for (Qrc& qrc : this->Rcc.Qrcs) {
        qrc.PathChecksum = fpathCheckSum.getPart(qrc.QrcFile);
        // RCC output file name
        {
          std::string rccFile = this->Dir.Build + "/";
          rccFile += qrc.PathChecksum;
          rccFile += "/qrc_";
          rccFile += qrc.QrcName;
          rccFile += ".cpp";
          qrc.RccFile = std::move(rccFile);
        }
        {
          std::string base = this->Dir.Info;
          base += "/RCC";
          base += qrc.QrcName;
          if (!qrc.Unique) {
            base += qrc.PathChecksum;
          }

          qrc.LockFile = base;
          qrc.LockFile += ".lock";

          qrc.InfoFile = base;
          qrc.InfoFile += "Info.cmake";

          qrc.SettingsFile = base;
          qrc.SettingsFile += "Settings.txt";

          if (this->MultiConfig) {
            for (std::string const& cfg : this->ConfigsList) {
              qrc.ConfigSettingsFile[cfg] =
                AppendFilenameSuffix(qrc.SettingsFile, "_" + cfg);
            }
          }
        }
      }
    }
    // RCC options
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Target options
      std::vector<std::string> opts = optionsTarget;
      // Merge computed "-name XYZ" option
      {
        std::string name = qrc.QrcName;
        // Replace '-' with '_'. The former is not valid for symbol names.
        std::replace(name.begin(), name.end(), '-', '_');
        if (!qrc.Unique) {
          name += "_";
          name += qrc.PathChecksum;
        }
        std::vector<std::string> nameOpts;
        nameOpts.emplace_back("-name");
        nameOpts.emplace_back(std::move(name));
        RccMergeOptions(opts, nameOpts, modernQt);
      }
      // Merge file option
      RccMergeOptions(opts, qrc.Options, modernQt);
      qrc.Options = std::move(opts);
    }
    // RCC resources
    for (Qrc& qrc : this->Rcc.Qrcs) {
      if (!qrc.Generated) {
        std::string error;
        RccLister const lister(this->Rcc.Executable,
                               this->Rcc.ExecutableFeatures->ListOptions);
        if (!lister.list(qrc.QrcFile, qrc.Resources, error)) {
          cmSystemTools::Error(error);
          return false;
        }
      }
    }
  }

  return true;
}